

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldOptions::SerializeWithCachedSizes
          (FieldOptions *this,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint uVar2;
  Type *value;
  int i;
  int index;
  
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 1) != 0) {
    internal::WireFormatLite::WriteEnum(1,this->ctype_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 2) != 0) {
    internal::WireFormatLite::WriteBool(2,this->packed_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 8) != 0) {
    internal::WireFormatLite::WriteBool(3,this->deprecated_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 4) != 0) {
    internal::WireFormatLite::WriteBool(5,this->lazy_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->experimental_map_key_->_M_dataplus)._M_p,
               (int)this->experimental_map_key_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(9,this->experimental_map_key_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 0x20) != 0) {
    internal::WireFormatLite::WriteBool(10,this->weak_,output);
  }
  for (index = 0; index < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void FieldOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (has_ctype()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->ctype(), output);
  }

  // optional bool packed = 2;
  if (has_packed()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->packed(), output);
  }

  // optional bool deprecated = 3 [default = false];
  if (has_deprecated()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->deprecated(), output);
  }

  // optional bool lazy = 5 [default = false];
  if (has_lazy()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(5, this->lazy(), output);
  }

  // optional string experimental_map_key = 9;
  if (has_experimental_map_key()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->experimental_map_key().data(), this->experimental_map_key().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      9, this->experimental_map_key(), output);
  }

  // optional bool weak = 10 [default = false];
  if (has_weak()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->weak(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}